

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O3

void __thiscall
AbstractTransaction_GetVariableInt_Test::TestBody(AbstractTransaction_GetVariableInt_Test *this)

{
  bool bVar1;
  void *wally_tx_pointer;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  TestTransaction tx;
  AssertionResult gtest_ar;
  uint64_t value;
  string test_data;
  AssertHelper local_88;
  Message local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelper local_70;
  TestTransaction local_68;
  string local_58;
  uint64_t local_38;
  string local_30;
  
  TestTransaction::TestTransaction(&local_68);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"fe11111111","");
  local_38 = 0;
  bVar1 = TestTransaction::GetVariableIntTest(&local_68,&local_30,&local_38);
  local_80.ss_.ptr_._0_4_ = CONCAT31(local_80.ss_.ptr_._1_3_,bVar1);
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&local_80,
               (AssertionResult *)"tx.GetVariableIntTest(test_data, &value)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x12f,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                       (char)local_58._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p) !=
        &local_58.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p));
    }
    if (local_88.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_88.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_88.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.ss_.ptr_._0_4_ = 0x11111111;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_58,"value","286331153",&local_38,(int *)&local_80);
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_80);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x130,message);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,local_80.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  wally_tx_pointer = (void *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  local_68.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&PTR__AbstractTransaction_006915b0;
  cfd::core::AbstractTransaction::FreeWallyAddress
            ((AbstractTransaction *)local_68.super_AbstractTransaction.wally_tx_pointer_,
             wally_tx_pointer);
  return;
}

Assistant:

TEST(AbstractTransaction, GetVariableInt) {
  TestTransaction tx;
  std::string test_data = "fe11111111";
  uint64_t value = 0;
  EXPECT_TRUE(tx.GetVariableIntTest(test_data, &value));
  EXPECT_EQ(value, 286331153);
}